

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeUnconditionalBranch(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  undefined4 local_2c;
  int32_t imm;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  local_2c = fieldFromInstruction(insn,0,0x1a);
  if ((local_2c & 0x2000000) != 0) {
    local_2c = local_2c | 0xfc000000;
  }
  MCOperand_CreateImm0(Inst,(long)(int)local_2c);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeUnconditionalBranch(MCInst *Inst, uint32_t insn,
		uint64_t Addr,
		void *Decoder)
{
	int32_t imm = fieldFromInstruction(insn, 0, 26);

	// Sign-extend the 26-bit immediate.
	if (imm & (1 << (26 - 1)))
		imm |= ~((1LL << 26) - 1);

	// if (!Dis->tryAddingSymbolicOperand(Inst, imm << 2, Addr, true, 0, 4))
	MCOperand_CreateImm0(Inst, imm);

	return Success;
}